

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

int32 Js::ByteCodeWriter::GetBranchLimit(void)

{
  bool bVar1;
  int *piVar2;
  int local_14 [2];
  int32 local_c;
  
  bVar1 = ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag);
  if (bVar1) {
    local_14[1] = 0x40;
    piVar2 = max<int>(&DAT_01ea9f18,local_14 + 1);
    local_14[0] = 0x8000;
    piVar2 = min<int>(piVar2,local_14);
    local_c = *piVar2;
  }
  else {
    local_c = 0x8000;
  }
  return local_c;
}

Assistant:

int32 ByteCodeWriter::GetBranchLimit()
    {
#ifdef BYTECODE_TESTING
        if (Js::Configuration::Global.flags.IsEnabled(Js::ByteCodeBranchLimitFlag))
        {
            // minimum 64
            return min(max(Js::Configuration::Global.flags.ByteCodeBranchLimit, 64), SHRT_MAX + 1);
        }
#endif

        return SHRT_MAX + 1;
    }